

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>::Equals
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_> *this,
          ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_aom_rc_mode>_>
          *other)

{
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  _Var1;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false> _Var2;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> _Var3;
  _Head_base<5UL,_testing::internal::ParamIterator<aom_rc_mode>,_false> _Var4;
  bool bVar5;
  undefined1 uVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_> *this_00;
  GTestLog local_1c;
  
  iVar7 = (*(this->
            super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_aom_rc_mode>_>
            )._vptr_ParamIteratorInterface[2])();
  iVar8 = (*other->_vptr_ParamIteratorInterface[2])(other);
  bVar5 = IsTrue(CONCAT44(extraout_var,iVar7) == CONCAT44(extraout_var_00,iVar8));
  if (!bVar5) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x36f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition BaseGenerator() == other.BaseGenerator() failed. ",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The program attempted to compare iterators ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"from different generators.",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    GTestLog::~GTestLog(&local_1c);
  }
  this_00 = CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int,aom_rc_mode>::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul,5ul>>const,testing::internal::ParamIteratorInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int,aom_rc_mode>>const>
                      (other);
  bVar5 = AtEnd(this);
  if ((bVar5) && (bVar5 = AtEnd(this_00), bVar5)) {
    return true;
  }
  _Var1._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
       ._M_head_impl;
  if ((((((_Var1._M_head_impl ==
           ((ParamIteratorInterface<const_libaom_test::CodecFactory_*> *)
           (this_00->current_).
           super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
           ._M_head_impl.impl_._M_t.
           super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
           )._M_head_impl) ||
         (iVar7 = (*(_Var1._M_head_impl)->_vptr_ParamIteratorInterface[6])(), (char)iVar7 != '\0'))
        && ((_Var2._M_head_impl =
                  (this->current_).
                  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                  .
                  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                  .
                  super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                  ._M_head_impl.impl_._M_t.
                  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                  .
                  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                  ._M_head_impl,
            _Var2._M_head_impl ==
            ((ParamIteratorInterface<libaom_test::TestMode> *)
            (this_00->current_).
            super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
            .
            super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
            .super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
            _M_head_impl.impl_._M_t.
            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
            .
            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
            )._M_head_impl ||
            (iVar7 = (*(_Var2._M_head_impl)->_vptr_ParamIteratorInterface[6])(), (char)iVar7 != '\0'
            )))) &&
       ((_Var3._M_head_impl =
              (this->current_).
              super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
              .
              super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
              .
              super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
              .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.
              impl_._M_t.
              super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
              .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
              _M_head_impl,
        _Var3._M_head_impl ==
        ((ParamIteratorInterface<int> *)
        (this_00->current_).
        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
        .
        super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
        .
        super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
        .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t
        .
        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>).
        _M_head_impl ||
        (iVar7 = (*(_Var3._M_head_impl)->_vptr_ParamIteratorInterface[6])(), (char)iVar7 != '\0'))))
      && ((_Var3._M_head_impl =
                (this->current_).
                super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                .
                super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                .
                super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                .
                super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                .super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.
                impl_._M_t.
                super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
                _M_head_impl,
          _Var3._M_head_impl ==
          ((ParamIteratorInterface<int> *)
          (this_00->current_).
          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
          .
          super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
          .
          super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
          .
          super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
          .super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_.
          _M_t.
          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
          .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>).
          _M_head_impl ||
          (iVar7 = (*(_Var3._M_head_impl)->_vptr_ParamIteratorInterface[6])(), (char)iVar7 != '\0'))
         )) && ((_Var3._M_head_impl =
                      (this->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                      .
                      super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                      .
                      super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                      .
                      super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                      .
                      super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                      .super__Head_base<4UL,_testing::internal::ParamIterator<int>,_false>.
                      _M_head_impl.impl_._M_t.
                      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                      .
                      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                      ._M_head_impl,
                _Var3._M_head_impl ==
                ((ParamIteratorInterface<int> *)
                (this_00->current_).
                super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                .
                super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                .
                super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                .
                super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                .
                super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                .super__Head_base<4UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.
                impl_._M_t.
                super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>).
                _M_head_impl ||
                (iVar7 = (*(_Var3._M_head_impl)->_vptr_ParamIteratorInterface[6])(),
                (char)iVar7 != '\0')))) {
    _Var4._M_head_impl.impl_._M_t.
    super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
    .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
    _M_head_impl = (this->current_).
                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                   .
                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                   .
                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                   .
                   super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                   .
                   super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                   .super__Tuple_impl<5UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
                   super__Head_base<5UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>.
                   _M_head_impl;
    if (_Var4._M_head_impl.impl_._M_t.
        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
        .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
        _M_head_impl ==
        (unique_ptr<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
         )*(unique_ptr<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
            *)&(this_00->current_).
               super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
               .
               super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
               .
               super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
               .
               super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
               .
               super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
               .super__Tuple_impl<5UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
               super__Head_base<5UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>) {
      uVar6 = 1;
    }
    else {
      uVar6 = (**(code **)(*(long *)_Var4._M_head_impl.impl_._M_t.
                                    super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                                    .
                                    super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>
                                    ._M_head_impl + 0x30))();
    }
  }
  else {
    uVar6 = 0;
  }
  return (bool)uVar6;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }